

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

EVaction INT_EVassoc_filter_action
                   (CManager_conflict cm,EVstone stone_num,FMStructDescList format_list,
                   EVSimpleHandlerFunc handler,EVstone out_stone_num,void *client_data)

{
  void **ppvVar1;
  undefined8 *puVar2;
  attr_list *pp_Var3;
  FILE *__stream;
  int iVar4;
  __pid_t _Var5;
  stone_type stone;
  long lVar6;
  _proto_action *p_Var7;
  FMFormat *pp_Var8;
  FMFormat p_Var9;
  pthread_t pVar10;
  uint uVar11;
  timespec ts;
  
  stone = stone_struct(cm->evp,stone_num);
  if (stone == (stone_type)0x0) {
    uVar11 = 0xffffffff;
  }
  else {
    uVar11 = stone->proto_action_count;
    lVar6 = (long)(int)uVar11;
    p_Var7 = (_proto_action *)INT_CMrealloc(stone->proto_actions,lVar6 * 0x60 + 0x60);
    stone->proto_actions = p_Var7;
    *(undefined8 *)(p_Var7 + lVar6) = 0;
    p_Var7[lVar6].input_format_requirements = (FMStructDescList)0x0;
    p_Var7[lVar6].matching_reference_formats = (FMFormat *)0x0;
    (((anon_union_48_6_c1ce387a_for_o *)(&p_Var7[lVar6].matching_reference_formats + 1))->term).
    handler = (EVSimpleHandlerFunc)0x0;
    ppvVar1 = &p_Var7[lVar6].o.term.client_data;
    *ppvVar1 = (void *)0x0;
    ppvVar1[1] = (void *)0x0;
    puVar2 = (undefined8 *)((long)&p_Var7[lVar6].o + 0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    pp_Var3 = &p_Var7[lVar6].o.bri.remote_contact;
    *pp_Var3 = (attr_list)0x0;
    pp_Var3[1] = (attr_list)0x0;
    p_Var7[lVar6].attrs = (attr_list)0x0;
    (&p_Var7[lVar6].attrs)[1] = (attr_list)0x0;
    p_Var7 = stone->proto_actions;
    p_Var7[lVar6].input_format_requirements = format_list;
    p_Var7[lVar6].action_type = Action_Filter;
    p_Var7[lVar6].o.term.handler = handler;
    stone->proto_actions[lVar6].o.term.client_data = client_data;
    stone->proto_actions[lVar6].o.term.target_stone_id = out_stone_num;
    p_Var7 = stone->proto_actions;
    p_Var7[lVar6].data_state = Requires_Decoded;
    p_Var7[lVar6].matching_reference_formats = (FMFormat *)0x0;
    if (format_list != (FMStructDescList)0x0) {
      pp_Var8 = (FMFormat *)INT_CMmalloc(0x10);
      stone->proto_actions[lVar6].matching_reference_formats = pp_Var8;
      p_Var9 = EVregister_format_set(cm,format_list);
      *stone->proto_actions[lVar6].matching_reference_formats = p_Var9;
      stone->proto_actions[lVar6].matching_reference_formats[1] = (FMFormat)0x0;
    }
    stone->proto_action_count = stone->proto_action_count + 1;
    clear_response_cache(stone);
    iVar4 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        __stream = (FILE *)cm->CMTrace_file;
        _Var5 = getpid();
        pVar10 = pthread_self();
        fprintf(__stream,"P%lxT%lx - ",(long)_Var5,pVar10);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"Adding filter action %d to stone %x\n",(ulong)uVar11,
              (ulong)(uint)stone_num);
    }
    fflush((FILE *)cm->CMTrace_file);
  }
  return uVar11;
}

Assistant:

EVstone
INT_EVassoc_filter_action(CManager cm, EVstone stone_num, 
		      FMStructDescList format_list, EVSimpleHandlerFunc handler,
		      EVstone out_stone_num, void *client_data)
{
#ifdef HAVE_COD_H
    event_path_data evp = cm->evp;
    stone_type stone;

    stone = stone_struct(evp, stone_num);
    if (!stone) return -1;

    int proto_action_num = stone->proto_action_count;
    stone->proto_actions = realloc(stone->proto_actions, 
				   (proto_action_num + 1) * 
				   sizeof(stone->proto_actions[0]));
    memset(&stone->proto_actions[proto_action_num], 0, 
	   sizeof(stone->proto_actions[0]));
    stone->proto_actions[proto_action_num].input_format_requirements =
	format_list;
    stone->proto_actions[proto_action_num].action_type = Action_Filter;
    stone->proto_actions[proto_action_num].o.term.handler = handler;
    stone->proto_actions[proto_action_num].o.term.client_data = client_data;
    stone->proto_actions[proto_action_num].o.term.target_stone_id = out_stone_num;
    stone->proto_actions[proto_action_num].data_state = Requires_Decoded;
    stone->proto_actions[proto_action_num].matching_reference_formats = NULL;
    if (format_list != NULL) {
	stone->proto_actions[proto_action_num].matching_reference_formats = 
	    malloc(2*sizeof(FMFormat));
	stone->proto_actions[proto_action_num].matching_reference_formats[0] = 
	    EVregister_format_set(cm, format_list);
	stone->proto_actions[proto_action_num].matching_reference_formats[1] = NULL;
    }	
    stone->proto_action_count++;
    clear_response_cache(stone);
    CMtrace_out(cm, EVerbose, "Adding filter action %d to stone %x\n",
		proto_action_num, stone_num);
    return proto_action_num;
#else
    fprintf(stderr, "No code generation in FFS, action unavailable\n");
    return -1;
#endif    
}